

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LispPrint.cpp
# Opt level: O0

void __thiscall SymbolTable::SymbolTable(SymbolTable *this)

{
  element_type *peVar1;
  shared_ptr<Form> *in_RDI;
  shared_ptr<Form> *in_stack_ffffffffffffffb8;
  
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
                   *)0x186c50);
  std::shared_ptr<Form>::shared_ptr((shared_ptr<Form> *)0x186c63);
  std::make_shared<Form>();
  std::shared_ptr<Form>::operator=(in_RDI,in_stack_ffffffffffffffb8);
  std::shared_ptr<Form>::~shared_ptr((shared_ptr<Form> *)0x186c8c);
  peVar1 = std::__shared_ptr_access<Form,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Form,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x186c9a);
  peVar1->kind = EMPTY_LIST;
  return;
}

Assistant:

SymbolTable::SymbolTable() {
  empty_pair = std::make_shared<Form>();
  empty_pair->kind = FormKind::EMPTY_LIST;
}